

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

RunMap * google::protobuf::compiler::cpp::anon_unknown_0::FindRuns
                   (RunMap *__return_storage_ptr__,
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *fields,function<bool_(const_google::protobuf::FieldDescriptor_*)> *predicate)

{
  pointer ppFVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  pointer ppFVar6;
  FieldDescriptor *last_start;
  key_type local_40;
  FieldDescriptor *local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_40 = (FieldDescriptor *)0x0;
  ppFVar6 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar6 != ppFVar1) {
    do {
      pFVar2 = *ppFVar6;
      local_38 = pFVar2;
      if ((predicate->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar5 = std::__throw_bad_function_call();
        std::
        _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&__return_storage_ptr__->_M_h);
        _Unwind_Resume(uVar5);
      }
      bVar3 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_38);
      if (bVar3) {
        if (local_40 == (FieldDescriptor *)0x0) {
          local_40 = pFVar2;
        }
        pmVar4 = std::__detail::
                 _Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)__return_storage_ptr__,&local_40);
        *pmVar4 = *pmVar4 + 1;
      }
      else {
        local_40 = (FieldDescriptor *)0x0;
      }
      ppFVar6 = ppFVar6 + 1;
    } while (ppFVar6 != ppFVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

RunMap FindRuns(const std::vector<const FieldDescriptor*>& fields,
                const std::function<bool(const FieldDescriptor*)>& predicate) {
  RunMap runs;
  const FieldDescriptor* last_start = nullptr;

  for (auto field : fields) {
    if (predicate(field)) {
      if (last_start == nullptr) {
        last_start = field;
      }

      runs[last_start]++;
    } else {
      last_start = nullptr;
    }
  }
  return runs;
}